

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_InitPrices(CLzmaEnc *p)

{
  UInt32 UVar1;
  CLzmaEnc *p_local;
  
  if (p->fastMode == 0) {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }
  UVar1 = p->numFastBytes - 1;
  (p->repLenEnc).tableSize = UVar1;
  (p->lenEnc).tableSize = UVar1;
  LenPriceEnc_UpdateTables(&p->lenEnc,1 << ((byte)p->pb & 0x1f),p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc,1 << ((byte)p->pb & 0x1f),p->ProbPrices);
  return;
}

Assistant:

void LzmaEnc_InitPrices(CLzmaEnc* p) {
  if (!p->fastMode) {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }

  p->lenEnc.tableSize =
      p->repLenEnc.tableSize =
          p->numFastBytes + 1 - LZMA_MATCH_LEN_MIN;
  LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc, 1 << p->pb, p->ProbPrices);
}